

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O0

void prepare_cdef_workers(AV1_COMP *cpi,AVxWorkerHook hook,int num_workers)

{
  AVxWorker *pAVar1;
  EncWorkerData *pEVar2;
  EncWorkerData *thread_data;
  AVxWorker *worker;
  int i;
  MultiThreadInfo *mt_info;
  int num_workers_local;
  AVxWorkerHook hook_local;
  AV1_COMP *cpi_local;
  
  for (i = num_workers + -1; -1 < i; i = i + -1) {
    pAVar1 = (cpi->mt_info).workers;
    pEVar2 = (cpi->mt_info).tile_thr_data + i;
    pEVar2->cpi = cpi;
    pAVar1[i].hook = hook;
    pAVar1[i].data1 = pEVar2;
    pAVar1[i].data2 = &(cpi->mt_info).cdef_sync;
  }
  return;
}

Assistant:

static void prepare_cdef_workers(AV1_COMP *cpi, AVxWorkerHook hook,
                                 int num_workers) {
  MultiThreadInfo *mt_info = &cpi->mt_info;
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *worker = &mt_info->workers[i];
    EncWorkerData *thread_data = &mt_info->tile_thr_data[i];

    thread_data->cpi = cpi;
    worker->hook = hook;
    worker->data1 = thread_data;
    worker->data2 = &mt_info->cdef_sync;
  }
}